

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::InitializeStackFunctions
          (InterpreterStackFrame *this,StackScriptFunction *scriptFunctions)

{
  ParseableFunctionInfo *this_00;
  NestedArray *pNVar1;
  FunctionProxy *this_01;
  ScriptFunctionType *deferredPrototypeType;
  ulong uVar2;
  uint i;
  ulong uVar3;
  
  *(StackScriptFunction **)(this + 0x48) = scriptFunctions;
  this_00 = *(ParseableFunctionInfo **)(this + 0x88);
  pNVar1 = (this_00->nestedArray).ptr;
  if (pNVar1 == (NestedArray *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)pNVar1->nestedCount;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    this_01 = ParseableFunctionInfo::GetNestedFunctionProxy(this_00,(uint)uVar3);
    deferredPrototypeType = FunctionProxy::EnsureDeferredPrototypeType(this_01);
    StackScriptFunction::StackScriptFunction(scriptFunctions,this_01,deferredPrototypeType);
    scriptFunctions = scriptFunctions + 1;
  }
  return;
}

Assistant:

void InterpreterStackFrame::InitializeStackFunctions(StackScriptFunction * scriptFunctions)
    {
        this->stackNestedFunctions = scriptFunctions;
        FunctionBody * functionBody = this->m_functionBody;
        uint nestedCount = functionBody->GetNestedCount();
        for (uint i = 0; i < nestedCount; i++)
        {
            StackScriptFunction * stackScriptFunction = scriptFunctions + i;
            FunctionProxy* nestedProxy = functionBody->GetNestedFunctionProxy(i);
            ScriptFunctionType* type = nestedProxy->EnsureDeferredPrototypeType();
            new (stackScriptFunction)StackScriptFunction(nestedProxy, type);
        }
    }